

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

PSprite __thiscall
DataSourceAmiga::get_game_object_sprite(DataSourceAmiga *this,size_t catalog,size_t index)

{
  uint8_t compression;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t filling;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint8_t *puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  byte bVar6;
  PBuffer *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  PBuffer PVar8;
  PSpriteAmiga PVar9;
  PSprite PVar10;
  PBuffer data;
  undefined8 local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  PSpriteAmiga mask;
  undefined8 local_60;
  element_type *local_58;
  undefined1 local_50 [8];
  element_type *local_48;
  PSpriteAmiga pixels;
  
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(catalog + 0x60);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  PVar8 = get_data_from_catalog((DataSourceAmiga *)&data,catalog,index,in_RCX);
  _Var7 = PVar8.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var7._M_pi = extraout_RDX;
  }
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
         (_func_int **)0x0;
    (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    puVar5 = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read;
    compression = *puVar5;
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 1;
    bVar1 = puVar5[1];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 2;
    bVar2 = puVar5[2];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 3;
    bVar3 = puVar5[3];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 4;
    bVar4 = puVar5[4];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 5;
    filling = puVar5[5];
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read = puVar5 + 6;
    bVar6 = 0x10;
    if (0x10 < bVar2) {
      bVar6 = bVar2;
    }
    local_90 = data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88 = data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi)->_M_use_count + 1;
      }
    }
    decode_mask_sprite((DataSourceAmiga *)&mask,(PBuffer *)(puVar5 + 5),(size_t)&local_90,
                       (ulong)(bVar6 + 7 & 0xfffffff8));
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
    Buffer::pop_tail((Buffer *)local_50);
    decode_planned_sprite
              ((DataSourceAmiga *)&pixels,(PBuffer *)(ulong)bVar4,(size_t)local_50,
               (ulong)(bVar6 + 7 >> 3),compression,filling,(uint8_t *)(ulong)bVar4,false);
    if (local_48 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
    }
    this_01._M_pi =
         mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    PVar9 = SpriteAmiga::get_amiga_masked
                      ((SpriteAmiga *)&stack0xffffffffffffffa0,
                       (PSprite *)
                       pixels.
                       super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    _Var7 = PVar9.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      _Var7._M_pi = extraout_RDX_00;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
           (_func_int **)0x0;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
      if (local_58 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
        _Var7._M_pi = extraout_RDX_01;
      }
    }
    else {
      *(_func_int **)(local_60 + 0x18) = (_func_int *)0x1;
      *(uint *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x20))->
                _vptr__Sp_counted_base = -(uint)bVar3;
      *(uint *)(local_60 + 0x24) = -(uint)bVar1;
      (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
           (_func_int **)local_60;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)local_58;
    }
    if (pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX_02;
    }
    if (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var7._M_pi = extraout_RDX_03;
    }
  }
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var7._M_pi = extraout_RDX_04;
  }
  PVar10.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  PVar10.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar10.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceAmiga::get_game_object_sprite(size_t catalog, size_t index) {
  PBuffer data = get_data_from_catalog(catalog, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  uint8_t h = data->pop<uint8_t>();
  uint8_t offset_y = data->pop<uint8_t>();
  uint8_t w = data->pop<uint8_t>();
  uint8_t offset_x = data->pop<uint8_t>();
  uint8_t filling = data->pop<uint8_t>();
  uint8_t compression = data->pop<uint8_t>();

  if (w < 16) w = 16;

  int width = (w+7)/8;

  PSpriteAmiga mask = decode_mask_sprite(data, width*8, h);
  PSpriteAmiga pixels = decode_planned_sprite(data->pop_tail(), width, h,
                                              compression, filling, palette);

  PSpriteAmiga sprite = pixels->get_amiga_masked(mask);
  if (!sprite) {
    return nullptr;
  }
  sprite->set_delta(1, 0);
  sprite->set_offset(-offset_x, -offset_y);

  return sprite;
}